

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSpvAsmInstructionTests.cpp
# Opt level: O1

string * __thiscall
vkt::SpirVAssembly::getByteWidthStr_abi_cxx11_
          (string *__return_storage_ptr__,SpirVAssembly *this,IntegerType type)

{
  char *pcVar1;
  uint uVar2;
  char *pcVar3;
  
  uVar2 = (uint)this;
  if (uVar2 < 6) {
    if ((9U >> (uVar2 & 0x1f) & 1) == 0) {
      if ((0x12U >> (uVar2 & 0x1f) & 1) == 0) {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        pcVar3 = "8";
        pcVar1 = "";
      }
      else {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        pcVar3 = "4";
        pcVar1 = "";
      }
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar3 = "2";
      pcVar1 = "";
    }
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar1 = "";
    pcVar3 = pcVar1;
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar3,pcVar1);
  return __return_storage_ptr__;
}

Assistant:

const string getByteWidthStr (IntegerType type)
{
	switch (type)
	{
		case INTEGER_TYPE_SIGNED_16:
		case INTEGER_TYPE_UNSIGNED_16:	return "2";

		case INTEGER_TYPE_SIGNED_32:
		case INTEGER_TYPE_UNSIGNED_32:	return "4";

		case INTEGER_TYPE_SIGNED_64:
		case INTEGER_TYPE_UNSIGNED_64:	return "8";

		default:						DE_ASSERT(false);
										return "";
	}
}